

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O1

void Assimp::Blender::DNA::ExtractArraySize(string *out,size_t *array_sizes)

{
  uint uVar1;
  pointer pcVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  char cVar6;
  
  array_sizes[1] = 1;
  *array_sizes = 1;
  lVar3 = ::std::__cxx11::string::find((char)out,0x5b);
  if (lVar3 != -1) {
    pcVar2 = (out->_M_dataplus)._M_p;
    cVar6 = pcVar2[lVar3 + 1];
    uVar5 = 0;
    if (0xf5 < (byte)(cVar6 - 0x3aU)) {
      pcVar4 = pcVar2 + lVar3 + 2;
      do {
        uVar1 = (uint)(byte)(cVar6 - 0x30) + (int)uVar5 * 10;
        uVar5 = (ulong)uVar1;
        cVar6 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (0xf5 < (byte)(cVar6 - 0x3aU));
      uVar5 = (ulong)uVar1;
    }
    *array_sizes = uVar5;
    lVar3 = ::std::__cxx11::string::find((char)out,0x5b);
    if (lVar3 != -1) {
      pcVar2 = (out->_M_dataplus)._M_p;
      cVar6 = pcVar2[lVar3 + 1];
      uVar5 = 0;
      if (0xf5 < (byte)(cVar6 - 0x3aU)) {
        pcVar4 = pcVar2 + lVar3 + 2;
        do {
          uVar1 = (uint)(byte)(cVar6 - 0x30) + (int)uVar5 * 10;
          uVar5 = (ulong)uVar1;
          cVar6 = *pcVar4;
          pcVar4 = pcVar4 + 1;
        } while (0xf5 < (byte)(cVar6 - 0x3aU));
        uVar5 = (ulong)uVar1;
      }
      array_sizes[1] = uVar5;
    }
  }
  return;
}

Assistant:

void  DNA :: ExtractArraySize(
    const std::string& out,
    size_t array_sizes[2]
)
{
    array_sizes[0] = array_sizes[1] = 1;
    std::string::size_type pos = out.find('[');
    if (pos++ == std::string::npos) {
        return;
    }
    array_sizes[0] = strtoul10(&out[pos]);

    pos = out.find('[',pos);
    if (pos++ == std::string::npos) {
        return;
    }
    array_sizes[1] = strtoul10(&out[pos]);
}